

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O1

void collect_mv_stats_b(MV_STATS *mv_stats,AV1_COMP *cpi,int mi_row,int mi_col)

{
  byte bVar1;
  MB_MODE_INFO *pMVar2;
  MB_MODE_INFO_EXT_FRAME *pMVar3;
  YV12_BUFFER_CONFIG *pYVar4;
  uint uVar5;
  int_mv *piVar6;
  byte bVar7;
  uint8_t *puVar8;
  char cVar9;
  char cVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  char cVar14;
  char cVar15;
  int iVar16;
  int8_t ref_idx_1;
  int iVar17;
  uint8_t *puVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  int col;
  ulong uVar23;
  int col_1;
  uint uVar24;
  uint uVar25;
  bool bVar26;
  MV cur_mv;
  MV ref_mv;
  int_mv local_50;
  int_mv local_4c;
  AV1_COMP *local_48;
  int local_40;
  int local_3c;
  int_mv *local_38;
  
  if ((mi_row < (cpi->common).mi_params.mi_rows) && (mi_col < (cpi->common).mi_params.mi_cols)) {
    pMVar2 = (cpi->common).mi_params.mi_grid_base
             [(cpi->common).mi_params.mi_stride * mi_row + mi_col];
    iVar12 = (mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [(cpi->common).mi_params.mi_alloc_bsize]) *
             (cpi->mbmi_ext_info).stride +
             mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [(cpi->common).mi_params.mi_alloc_bsize];
    pMVar3 = (cpi->mbmi_ext_info).frame_base;
    if (((pMVar2->field_0xa7 & 0x80) == 0) && (pMVar2->ref_frame[0] < '\x01')) {
      mv_stats->intra_count = mv_stats->intra_count + 1;
    }
    else {
      mv_stats->inter_count = mv_stats->inter_count + 1;
      bVar1 = pMVar2->mode;
      cVar15 = pMVar2->ref_frame[1];
      local_48 = cpi;
      local_40 = mi_row;
      local_3c = mi_col;
      if ((bVar1 & 0xf7) == 0x10) {
        local_38 = pMVar3[iVar12].global_mvs;
        lVar22 = 0;
        do {
          cVar10 = pMVar2->ref_frame[0];
          uVar5 = (*(ushort *)&pMVar2->field_0xa7 >> 4 & 3) +
                  (uint)((byte)(pMVar2->mode - 0x15) < 2);
          cVar14 = pMVar2->ref_frame[1];
          if ('\0' < cVar14) {
            cVar9 = -1;
            if (cVar14 < '\x05' || '\x04' < cVar10) {
              lVar13 = 0;
              do {
                if ((cVar10 == (&comp_ref0_lut)[lVar13]) && (cVar14 == (&comp_ref1_lut)[lVar13])) {
                  cVar9 = (char)lVar13;
                  break;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != 9);
            }
            if (cVar9 < '\0') {
              cVar10 = cVar14 * '\x04' + cVar10 + -0xd;
            }
            else {
              cVar10 = cVar9 + '\x14';
            }
          }
          if (cVar14 < '\x01') {
            piVar6 = local_38 + cVar10;
            if (uVar5 < pMVar3[iVar12].ref_mv_count) {
              piVar6 = &pMVar3[iVar12].ref_mv_stack[uVar5].this_mv;
            }
          }
          else {
            piVar6 = &pMVar3[iVar12].ref_mv_stack[uVar5].comp_mv;
            if (lVar22 == 0) {
              piVar6 = &pMVar3[iVar12].ref_mv_stack[uVar5].this_mv;
            }
          }
          local_4c = *piVar6;
          local_50 = pMVar2->mv[lVar22];
          keep_one_mv_stat(mv_stats,&local_4c.as_mv,&local_50.as_mv,local_48);
        } while ((lVar22 == 0) && (lVar22 = 1, '\0' < cVar15));
      }
      else {
        bVar26 = (bVar1 - 0x13 & 0xfd) == 0;
        if ((byte)(bVar1 - 0x13) < 4) {
          mv_stats->default_mvs = mv_stats->default_mvs + 1;
          uVar5 = (*(ushort *)&pMVar2->field_0xa7 >> 4 & 3) + (uint)((byte)(bVar1 - 0x15) < 2);
          cVar15 = pMVar2->ref_frame[0];
          cVar10 = pMVar2->ref_frame[1];
          if ('\0' < cVar10) {
            cVar14 = -1;
            if (cVar10 < '\x05' || '\x04' < cVar15) {
              lVar22 = 0;
              do {
                if ((cVar15 == (&comp_ref0_lut)[lVar22]) && (cVar10 == (&comp_ref1_lut)[lVar22])) {
                  cVar14 = (char)lVar22;
                  break;
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 != 9);
            }
            if (cVar14 < '\0') {
              cVar15 = cVar10 * '\x04' + cVar15 + -0xd;
            }
            else {
              cVar15 = cVar14 + '\x14';
            }
          }
          if (cVar10 < '\x01') {
            piVar6 = pMVar3[iVar12].global_mvs + cVar15;
            if (uVar5 < pMVar3[iVar12].ref_mv_count) {
              piVar6 = &pMVar3[iVar12].ref_mv_stack[uVar5].this_mv;
            }
          }
          else {
            piVar6 = &pMVar3[iVar12].ref_mv_stack[uVar5].this_mv;
            if (bVar26) {
              piVar6 = &pMVar3[iVar12].ref_mv_stack[uVar5].comp_mv;
            }
          }
          local_4c = *piVar6;
          local_50 = pMVar2->mv[bVar26];
          keep_one_mv_stat(mv_stats,&local_4c.as_mv,&local_50.as_mv,cpi);
        }
        else {
          mv_stats->default_mvs = (uint)('\0' < cVar15) + mv_stats->default_mvs + 1;
        }
      }
      bVar1 = block_size_high[pMVar2->bsize];
      pYVar4 = local_48->source;
      iVar12 = (pYVar4->field_4).field_0.y_stride;
      lVar22 = (long)iVar12;
      local_3c = local_3c << 2;
      if ((pYVar4->flags & 8) == 0) {
        lVar13 = (long)local_40 * 4 * lVar22;
        uVar5 = (uint)block_size_wide[pMVar2->bsize];
        if (uVar5 < 3) {
          uVar5 = 2;
        }
        uVar11 = 2;
        if (2 < bVar1) {
          uVar11 = (uint)bVar1;
        }
        puVar8 = (pYVar4->field_5).buffers[0] + lVar13 + lVar22 + local_3c;
        iVar12 = mv_stats->horz_text;
        iVar16 = mv_stats->vert_text;
        iVar17 = mv_stats->diag_text;
        puVar18 = (pYVar4->field_5).buffers[0] + lVar13 + local_3c + 1;
        uVar20 = 0;
        do {
          uVar23 = 0;
          do {
            uVar24 = (uint)puVar18[uVar23] - (uint)puVar18[uVar23 - 1];
            uVar21 = -uVar24;
            if (0 < (int)uVar24) {
              uVar21 = uVar24;
            }
            uVar25 = (uint)puVar8[uVar23] - (uint)puVar18[uVar23 - 1];
            uVar24 = -uVar25;
            if (0 < (int)uVar25) {
              uVar24 = uVar25;
            }
            iVar12 = iVar12 + (uVar21 & 0xff);
            mv_stats->horz_text = iVar12;
            iVar16 = iVar16 + (uVar24 & 0xff);
            mv_stats->vert_text = iVar16;
            iVar17 = iVar17 + (uVar24 & 0xff) * (uVar21 & 0xff);
            mv_stats->diag_text = iVar17;
            uVar23 = uVar23 + 1;
          } while (uVar5 - 1 != uVar23);
          uVar20 = uVar20 + 1;
          puVar8 = puVar8 + lVar22;
          puVar18 = puVar18 + lVar22;
        } while (uVar20 != uVar11 - 1);
      }
      else {
        puVar8 = (pYVar4->field_5).field_0.y_buffer;
        lVar13 = (long)((int)((long)local_40 * 4) * iVar12);
        bVar7 = (char)((local_48->common).seq_params)->bit_depth - 8;
        uVar5 = (uint)block_size_wide[pMVar2->bsize];
        if (uVar5 < 3) {
          uVar5 = 2;
        }
        uVar11 = 2;
        if (2 < bVar1) {
          uVar11 = (uint)bVar1;
        }
        lVar19 = lVar13 * 2 + (long)puVar8 * 2 + (long)local_3c * 2 + lVar22 * 2;
        iVar12 = mv_stats->horz_text;
        iVar16 = mv_stats->vert_text;
        iVar17 = mv_stats->diag_text;
        lVar13 = (long)local_3c * 2 + lVar13 * 2 + (long)puVar8 * 2 + 2;
        uVar20 = 0;
        do {
          uVar23 = 0;
          do {
            uVar25 = (uint)*(ushort *)(lVar13 + -2 + uVar23 * 2);
            uVar24 = *(ushort *)(lVar13 + uVar23 * 2) - uVar25;
            uVar21 = -uVar24;
            if (0 < (int)uVar24) {
              uVar21 = uVar24;
            }
            uVar24 = (uVar21 & 0xffff) >> (bVar7 & 0x1f);
            uVar25 = *(ushort *)(lVar19 + uVar23 * 2) - uVar25;
            uVar21 = -uVar25;
            if (0 < (int)uVar25) {
              uVar21 = uVar25;
            }
            uVar21 = (uVar21 & 0xffff) >> (bVar7 & 0x1f);
            iVar12 = iVar12 + uVar24;
            iVar16 = iVar16 + uVar21;
            iVar17 = iVar17 + uVar21 * uVar24;
            uVar23 = uVar23 + 1;
          } while (uVar5 - 1 != uVar23);
          uVar20 = uVar20 + 1;
          lVar19 = lVar19 + lVar22 * 2;
          lVar13 = lVar13 + lVar22 * 2;
        } while (uVar20 != uVar11 - 1);
        mv_stats->horz_text = iVar12;
        mv_stats->vert_text = iVar16;
        mv_stats->diag_text = iVar17;
      }
    }
  }
  return;
}

Assistant:

static inline void collect_mv_stats_b(MV_STATS *mv_stats, const AV1_COMP *cpi,
                                      int mi_row, int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) {
    return;
  }

  const MB_MODE_INFO *mbmi =
      mi_params->mi_grid_base[mi_row * mi_params->mi_stride + mi_col];
  const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame =
      cpi->mbmi_ext_info.frame_base +
      get_mi_ext_idx(mi_row, mi_col, cm->mi_params.mi_alloc_bsize,
                     cpi->mbmi_ext_info.stride);

  if (!is_inter_block(mbmi)) {
    mv_stats->intra_count++;
    return;
  }
  mv_stats->inter_count++;

  const PREDICTION_MODE mode = mbmi->mode;
  const int is_compound = has_second_ref(mbmi);

  if (mode == NEWMV || mode == NEW_NEWMV) {
    // All mvs are new
    for (int ref_idx = 0; ref_idx < 1 + is_compound; ++ref_idx) {
      const MV ref_mv =
          get_ref_mv_for_mv_stats(mbmi, mbmi_ext_frame, ref_idx).as_mv;
      const MV cur_mv = mbmi->mv[ref_idx].as_mv;
      keep_one_mv_stat(mv_stats, &ref_mv, &cur_mv, cpi);
    }
  } else if (mode == NEAREST_NEWMV || mode == NEAR_NEWMV ||
             mode == NEW_NEARESTMV || mode == NEW_NEARMV) {
    // has exactly one new_mv
    mv_stats->default_mvs += 1;

    const int ref_idx = (mode == NEAREST_NEWMV || mode == NEAR_NEWMV);
    const MV ref_mv =
        get_ref_mv_for_mv_stats(mbmi, mbmi_ext_frame, ref_idx).as_mv;
    const MV cur_mv = mbmi->mv[ref_idx].as_mv;

    keep_one_mv_stat(mv_stats, &ref_mv, &cur_mv, cpi);
  } else {
    // No new_mv
    mv_stats->default_mvs += 1 + is_compound;
  }

  // Add texture information
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int num_rows = block_size_high[bsize];
  const int num_cols = block_size_wide[bsize];
  const int y_stride = cpi->source->y_stride;
  const int px_row = 4 * mi_row, px_col = 4 * mi_col;
  const int buf_is_hbd = cpi->source->flags & YV12_FLAG_HIGHBITDEPTH;
  const int bd = cm->seq_params->bit_depth;
  if (buf_is_hbd) {
    uint16_t *source_buf =
        CONVERT_TO_SHORTPTR(cpi->source->y_buffer) + px_row * y_stride + px_col;
    for (int row = 0; row < num_rows - 1; row++) {
      for (int col = 0; col < num_cols - 1; col++) {
        const int offset = row * y_stride + col;
        const int horz_diff =
            abs(source_buf[offset + 1] - source_buf[offset]) >> (bd - 8);
        const int vert_diff =
            abs(source_buf[offset + y_stride] - source_buf[offset]) >> (bd - 8);
        mv_stats->horz_text += horz_diff;
        mv_stats->vert_text += vert_diff;
        mv_stats->diag_text += horz_diff * vert_diff;
      }
    }
  } else {
    uint8_t *source_buf = cpi->source->y_buffer + px_row * y_stride + px_col;
    for (int row = 0; row < num_rows - 1; row++) {
      for (int col = 0; col < num_cols - 1; col++) {
        const int offset = row * y_stride + col;
        const int horz_diff = abs(source_buf[offset + 1] - source_buf[offset]);
        const int vert_diff =
            abs(source_buf[offset + y_stride] - source_buf[offset]);
        mv_stats->horz_text += horz_diff;
        mv_stats->vert_text += vert_diff;
        mv_stats->diag_text += horz_diff * vert_diff;
      }
    }
  }
}